

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O0

bool DecodeHexTx(CMutableTransaction *tx,string *hex_tx,bool try_no_witness,bool try_witness)

{
  long lVar1;
  string_view hex_str;
  bool bVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  undefined2 uVar3;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  byte bVar4;
  CMutableTransaction *in_stack_ffffffffffffffe0;
  pointer in_stack_ffffffffffffffe8;
  
  uVar3 = (undefined2)((ulong)in_RDI >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff98);
  bVar2 = IsHex(in_stack_ffffffffffffffa0);
  if (bVar2) {
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff98);
    this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0;
    hex_str._M_str = (char *)in_stack_ffffffffffffffe8;
    hex_str._M_len = (size_t)in_stack_ffffffffffffffe0;
    ParseHex<unsigned_char>(hex_str);
    bVar4 = DecodeTx(in_stack_ffffffffffffffe0,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                     SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  }
  else {
    bVar4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeHexTx(CMutableTransaction& tx, const std::string& hex_tx, bool try_no_witness, bool try_witness)
{
    if (!IsHex(hex_tx)) {
        return false;
    }

    std::vector<unsigned char> txData(ParseHex(hex_tx));
    return DecodeTx(tx, txData, try_no_witness, try_witness);
}